

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O0

void __thiscall CharScanner::~CharScanner(CharScanner *this)

{
  TokenStream *in_RDI;
  RefCount<LexerInputState> *unaff_retaddr;
  
  in_RDI->_vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_0036c748;
  RefCount<LexerInputState>::~RefCount(unaff_retaddr);
  RefCount<Token>::~RefCount((RefCount<Token> *)unaff_retaddr);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x2907f6);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  TokenStream::~TokenStream(in_RDI);
  return;
}

Assistant:

CharScanner::~CharScanner()
{
}